

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_equation.hpp
# Opt level: O3

ostream * viennamath::operator<<
                    (ostream *stream,
                    ct_equation<viennamath::ct_variable<0UL>,_viennamath::ct_variable<1UL>_>
                    *param_2)

{
  ostream *poVar1;
  ct_variable<1UL> local_12;
  ct_variable<0UL> local_11;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"ct_equation(",0xc);
  poVar1 = operator<<(stream,&local_11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
  poVar1 = operator<<(poVar1,&local_12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream & stream, ct_equation<LHS, RHS> const & /*u*/)
  {
    stream << "ct_equation(" << LHS() << " = " << RHS() << ")";
    return stream;
  }